

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O1

int X509V3_EXT_add_alias(int nid_to,int nid_from)

{
  int iVar1;
  X509V3_EXT_METHOD *pXVar2;
  X509V3_EXT_METHOD *ext;
  long lVar3;
  int iVar4;
  X509V3_EXT_METHOD *pXVar5;
  byte bVar6;
  
  bVar6 = 0;
  pXVar2 = X509V3_EXT_get_nid(nid_from);
  if (pXVar2 == (X509V3_EXT_METHOD *)0x0) {
    iVar4 = 0;
    ERR_put_error(0x14,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_lib.cc"
                  ,0x6f);
  }
  else {
    ext = (X509V3_EXT_METHOD *)OPENSSL_malloc(0x68);
    iVar4 = 0;
    if (ext != (X509V3_EXT_METHOD *)0x0) {
      pXVar5 = ext;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        iVar4 = pXVar2->ext_flags;
        pXVar5->ext_nid = pXVar2->ext_nid;
        pXVar5->ext_flags = iVar4;
        pXVar2 = (X509V3_EXT_METHOD *)((long)pXVar2 + (ulong)bVar6 * -0x10 + 8);
        pXVar5 = (X509V3_EXT_METHOD *)((long)pXVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      ext->ext_nid = nid_to;
      iVar1 = X509V3_EXT_add(ext);
      iVar4 = 1;
      if (iVar1 == 0) {
        OPENSSL_free(ext);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int X509V3_EXT_add_alias(int nid_to, int nid_from) {
  OPENSSL_BEGIN_ALLOW_DEPRECATED
  const X509V3_EXT_METHOD *ext;
  X509V3_EXT_METHOD *tmpext;

  if (!(ext = X509V3_EXT_get_nid(nid_from))) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_NOT_FOUND);
    return 0;
  }
  if (!(tmpext =
            (X509V3_EXT_METHOD *)OPENSSL_malloc(sizeof(X509V3_EXT_METHOD)))) {
    return 0;
  }
  *tmpext = *ext;
  tmpext->ext_nid = nid_to;
  if (!X509V3_EXT_add(tmpext)) {
    OPENSSL_free(tmpext);
    return 0;
  }
  return 1;
  OPENSSL_END_ALLOW_DEPRECATED
}